

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void initialize_imputer<InputData<float,long>,long_double>
               (Imputer *imputer,InputData<float,_long> *input_data,size_t ntrees,int nthreads)

{
  vector<double,_std::allocator<double>_> *this;
  float fVar1;
  size_t sVar2;
  pointer pdVar3;
  pointer pdVar4;
  float *pfVar5;
  long *plVar6;
  pointer piVar7;
  pointer pIVar8;
  pointer __s;
  pointer pvVar9;
  ulong uVar10;
  undefined4 in_register_0000000c;
  long lVar11;
  pointer *ppIVar12;
  ulong uVar13;
  pointer pIVar14;
  ulong uVar15;
  long lVar16;
  pointer *ppIVar17;
  size_t sVar18;
  long lVar19;
  bool bVar20;
  double dVar21;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cat_counts;
  allocator_type local_a9;
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  local_a8;
  pointer *local_88;
  size_t local_80;
  int *local_78;
  int *local_70;
  double local_68;
  size_t local_60;
  double local_58;
  size_t local_50;
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  local_48;
  
  imputer->ncols_numeric = input_data->ncols_numeric;
  sVar2 = input_data->ncols_categ;
  imputer->ncols_categ = sVar2;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
            ((vector<int,std::allocator<int>> *)&imputer->ncat,input_data->ncat,
             input_data->ncat + sVar2,CONCAT44(in_register_0000000c,nthreads));
  this = &imputer->col_means;
  if ((imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_a8.
    super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              (this,input_data->ncols_numeric,(value_type_conflict *)&local_a8);
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize(this,input_data->ncols_numeric);
    pdVar3 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar3 != pdVar4) {
      memset(pdVar3,0,((long)pdVar4 + (-8 - (long)pdVar3) & 0xfffffffffffffff8U) + 8);
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(&imputer->col_modes,input_data->ncols_categ);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::vector(&local_48,ntrees,&local_a9);
  local_a8.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (imputer->imputer_tree).
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (imputer->imputer_tree).
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (imputer->imputer_tree).
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_a8.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (imputer->imputer_tree).
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (imputer->imputer_tree).
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (imputer->imputer_tree).
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::~vector(&local_48);
  pfVar5 = input_data->numeric_data;
  if (pfVar5 == (float *)0x0) {
    plVar6 = input_data->Xc_indptr;
    if ((plVar6 != (long *)0x0) && (input_data->ncols_numeric != 0)) {
      uVar15 = 0;
      do {
        local_60 = input_data->nrows;
        lVar11 = plVar6[uVar15];
        lVar19 = plVar6[uVar15 + 1];
        if (lVar11 < lVar19) {
          pfVar5 = input_data->Xc;
          pdVar3 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            fVar1 = pfVar5[lVar11];
            if (NAN(fVar1)) {
              pdVar3[uVar15] = pdVar3[uVar15] + 0.0;
              lVar16 = -1;
            }
            else {
              dVar21 = 0.0;
              if (ABS(fVar1) != INFINITY) {
                dVar21 = (double)fVar1;
              }
              pdVar3[uVar15] = dVar21 + pdVar3[uVar15];
              lVar16 = -(ulong)(ABS(fVar1) == INFINITY);
            }
            local_60 = local_60 + lVar16;
            lVar11 = lVar11 + 1;
          } while (lVar19 != lVar11);
        }
        pdVar3 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_68 = (double)((float)pdVar3[uVar15] /
                           ((float)(long)local_60 + (float)(&DAT_0036e0d8)[(long)local_60 < 0]));
        dVar21 = NAN;
        if (local_60 != 0) {
          dVar21 = local_68;
        }
        pdVar3[uVar15] = dVar21;
        uVar15 = uVar15 + 1;
      } while (uVar15 < input_data->ncols_numeric);
    }
  }
  else if (input_data->ncols_numeric != 0) {
    lVar11 = 0;
    uVar15 = 0;
    do {
      sVar2 = input_data->nrows;
      if (sVar2 == 0) {
        local_50 = 0;
      }
      else {
        pdVar3 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        sVar18 = 0;
        local_50 = sVar2;
        do {
          fVar1 = *(float *)((long)pfVar5 + sVar18 * 4 + sVar2 * lVar11);
          if (NAN(fVar1)) {
            pdVar3[uVar15] = pdVar3[uVar15] + 0.0;
            lVar19 = -1;
          }
          else {
            dVar21 = 0.0;
            if (ABS(fVar1) != INFINITY) {
              dVar21 = (double)fVar1;
            }
            pdVar3[uVar15] = dVar21 + pdVar3[uVar15];
            lVar19 = -(ulong)(ABS(fVar1) == INFINITY);
          }
          local_50 = local_50 + lVar19;
          sVar18 = sVar18 + 1;
        } while (sVar2 != sVar18);
      }
      pdVar3 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_58 = (double)((float)pdVar3[uVar15] /
                         ((float)(long)local_50 + (float)(&DAT_0036e0d8)[(long)local_50 < 0]));
      dVar21 = NAN;
      if (local_50 != 0) {
        dVar21 = local_58;
      }
      pdVar3[uVar15] = dVar21;
      uVar15 = uVar15 + 1;
      lVar11 = lVar11 + 4;
    } while (uVar15 < input_data->ncols_numeric);
  }
  if (input_data->categ_data != (int *)0x0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,
               (long)input_data->max_categ,(allocator_type *)&local_48);
    pvVar9 = local_a8.
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __s = local_a8.
          super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    if (input_data->ncols_categ != 0) {
      local_78 = input_data->categ_data;
      local_70 = input_data->ncat;
      local_88 = &((local_a8.
                    super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      piVar7 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_80 = ((long)local_a8.
                        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish +
                  (-8 - (long)local_a8.
                              super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8;
      lVar11 = 0;
      uVar15 = 0;
      do {
        if (__s != pvVar9) {
          memset(__s,0,local_80);
        }
        uVar10 = input_data->nrows;
        if (uVar10 != 0) {
          lVar19 = uVar10 * lVar11;
          uVar13 = 0;
          do {
            lVar16 = (long)*(int *)((long)local_78 + uVar13 * 4 + lVar19);
            if (-1 < lVar16) {
              ppIVar12 = &(__s->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl
                          .super__Vector_impl_data._M_start + lVar16;
              *ppIVar12 = (pointer)((long)&((*ppIVar12)->num_sum).
                                           super__Vector_base<double,_std::allocator<double>_> + 1);
              uVar10 = input_data->nrows;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < uVar10);
        }
        ppIVar12 = (pointer *)__s;
        if (1 < (ulong)(long)local_70[uVar15]) {
          pIVar14 = (__s->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar19 = (long)local_70[uVar15] * 8 + -8;
          ppIVar17 = local_88;
          do {
            pIVar8 = *ppIVar17;
            bVar20 = pIVar14 < pIVar8;
            if (pIVar14 <= pIVar8) {
              pIVar14 = pIVar8;
            }
            if (bVar20) {
              ppIVar12 = ppIVar17;
            }
            ppIVar17 = ppIVar17 + 1;
            lVar19 = lVar19 + -8;
          } while (lVar19 != 0);
        }
        piVar7[uVar15] = (int)((ulong)((long)ppIVar12 - (long)__s) >> 3);
        uVar15 = uVar15 + 1;
        lVar11 = lVar11 + 4;
      } while (uVar15 < input_data->ncols_categ);
    }
    if (local_a8.
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void initialize_imputer(Imputer &imputer, InputData &input_data, size_t ntrees, int nthreads)
{
    imputer.ncols_numeric  =  input_data.ncols_numeric;
    imputer.ncols_categ    =  input_data.ncols_categ;
    imputer.ncat.assign(input_data.ncat, input_data.ncat + input_data.ncols_categ);
    if (imputer.col_means.size())
    {
        imputer.col_means.resize(input_data.ncols_numeric);
        std::fill(imputer.col_means.begin(), imputer.col_means.end(), 0);
    }

    else
    {
        imputer.col_means.resize(input_data.ncols_numeric, 0);
    }

    imputer.col_modes.resize(input_data.ncols_categ);
    imputer.imputer_tree = std::vector<std::vector<ImputeNode>>(ntrees);

    /* TODO: here should use sample weights if specified as density */
    size_t offset, cnt;
    if (input_data.numeric_data != NULL)
    {
        #pragma omp parallel for schedule(static) num_threads(nthreads) private(cnt, offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt    = input_data.nrows;
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.numeric_data[row + offset]))?
                                           input_data.numeric_data[row + offset] : 0;
                cnt -= is_na_or_inf(input_data.numeric_data[row + offset]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    else if (input_data.Xc_indptr != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) private(cnt) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt = input_data.nrows;
            for (auto ix = input_data.Xc_indptr[col]; ix < input_data.Xc_indptr[col + 1]; ix++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.Xc[ix]))?
                                           input_data.Xc[ix] : 0;
                cnt -= is_na_or_inf(input_data.Xc[ix]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    if (input_data.categ_data != NULL)
    {
        std::vector<size_t> cat_counts(input_data.max_categ);
        #pragma omp parallel for schedule(static) num_threads(nthreads) firstprivate(cat_counts) private(offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_categ; col++)
        {
            std::fill(cat_counts.begin(), cat_counts.end(), 0);
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                if (input_data.categ_data[row + offset] >= 0)
                    cat_counts[input_data.categ_data[row + offset]]++;
            }
            imputer.col_modes[col] = (int) std::distance(cat_counts.begin(),
                                                         std::max_element(cat_counts.begin(),
                                                                           cat_counts.begin() + input_data.ncat[col]));
        }
    }
}